

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O0

void __thiscall ChronoTest_FormatSpecs_Test::TestBody(ChronoTest_FormatSpecs_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffff5e0;
  undefined1 in_stack_fffffffffffff5e7;
  char (*in_stack_fffffffffffff5e8) [9];
  duration<long,std::ratio<1l,1l>> *pdVar5;
  char *in_stack_fffffffffffff5f0;
  string *actual_expression;
  char *in_stack_fffffffffffff5f8;
  int line;
  undefined7 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff607;
  undefined8 in_stack_fffffffffffff608;
  Type TVar6;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffff610;
  duration<long,_std::ratio<1L,_1L>_> *args;
  char (*in_stack_fffffffffffff618) [12];
  Message *in_stack_fffffffffffff658;
  undefined7 in_stack_fffffffffffff660;
  undefined1 in_stack_fffffffffffff667;
  int local_734;
  duration<long,std::ratio<1l,1l>> local_730 [8];
  string local_728 [32];
  AssertionResult local_708 [2];
  int local_6e4;
  duration<long,std::ratio<1l,1l>> local_6e0 [8];
  duration<long,_std::ratio<1L,_1L>_> local_6d8 [4];
  AssertionResult local_6b8 [2];
  int local_694;
  duration<long,std::ratio<1l,1l>> local_690 [8];
  string local_688 [32];
  AssertionResult local_668 [2];
  int local_644;
  duration<long,std::ratio<3600l,1l>> local_640 [8];
  string local_638 [32];
  AssertionResult local_618 [2];
  int local_5f4;
  duration<long,std::ratio<3600l,1l>> local_5f0 [8];
  string local_5e8 [32];
  AssertionResult local_5c8 [2];
  int local_5a4;
  duration<long,std::ratio<3600l,1l>> local_5a0 [8];
  string local_598 [32];
  AssertionResult local_578 [2];
  int local_554;
  duration<long,std::ratio<3600l,1l>> local_550 [8];
  string local_548 [32];
  AssertionResult local_528 [2];
  int local_504;
  duration<long,std::ratio<3600l,1l>> local_500 [8];
  string local_4f8 [32];
  AssertionResult local_4d8 [2];
  int local_4b4;
  duration<long,std::ratio<60l,1l>> local_4b0 [8];
  string local_4a8 [32];
  AssertionResult local_488 [2];
  int local_464;
  duration<long,std::ratio<3600l,1l>> local_460 [8];
  string local_458 [32];
  AssertionResult local_438 [2];
  int local_414;
  duration<long,std::ratio<3600l,1l>> local_410 [8];
  string local_408 [32];
  AssertionResult local_3e8 [2];
  int local_3c4;
  duration<long,std::ratio<3600l,1l>> local_3c0 [8];
  string local_3b8 [32];
  AssertionResult local_398 [2];
  int local_374;
  duration<long,std::ratio<1l,1l>> local_370 [8];
  string local_368 [32];
  AssertionResult local_348 [2];
  int local_324;
  duration<long,std::ratio<60l,1l>> local_320 [8];
  string local_318 [32];
  AssertionResult local_2f8 [2];
  int local_2d4;
  duration<long,std::ratio<60l,1l>> local_2d0 [8];
  string local_2c8 [32];
  AssertionResult local_2a8 [2];
  int local_284;
  duration<long,std::ratio<60l,1l>> local_280 [8];
  string local_278 [32];
  AssertionResult local_258 [2];
  int local_234;
  duration<long,std::ratio<1l,1000l>> local_230 [8];
  string local_228 [32];
  AssertionResult local_208 [2];
  int local_1e4;
  duration<long,std::ratio<1l,1l>> local_1e0 [8];
  string local_1d8 [32];
  AssertionResult local_1b8 [2];
  int local_194;
  duration<long,std::ratio<1l,1l>> local_190 [8];
  string local_188 [32];
  AssertionResult local_168 [2];
  int local_144;
  duration<long,std::ratio<1l,1l>> local_140 [8];
  string local_138 [32];
  AssertionResult local_118 [2];
  int local_f4;
  duration<long,std::ratio<1l,1l>> local_f0 [8];
  string local_e8 [32];
  AssertionResult local_c8 [2];
  int local_a4;
  duration<long,std::ratio<1l,1l>> local_a0 [8];
  string local_98 [32];
  AssertionResult local_78 [3];
  int local_44;
  duration<long,std::ratio<1l,1l>> local_40 [8];
  string local_38 [32];
  AssertionResult local_18;
  
  TVar6 = (Type)((ulong)in_stack_fffffffffffff608 >> 0x20);
  local_44 = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_40,&local_44);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [2])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10e5c7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10e62a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e682);
  local_a4 = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_a0,&local_a4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [2])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10e79c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10e7ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e857);
  local_f4 = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_f0,&local_f4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [2])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10e971);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10e9d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ea2c);
  local_144 = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_140,&local_144);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10eb46);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10eba9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ec01);
  local_194 = 0x3c;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_190,&local_194);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10ed1b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10ed7e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10edd6);
  local_1e4 = 0x2a;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_1e0,&local_1e4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10eef0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10ef53);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10efab);
  local_234 = 0x4d2;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_230,&local_234);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [7])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f0c5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10f128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f180);
  local_284 = 0;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_280,&local_284);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<60l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f29a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10f2fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f355);
  local_2d4 = 0x3c;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_2d0,&local_2d4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<60l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f46f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10f4d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f52a);
  local_324 = 0x2a;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_320,&local_324);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<60l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f644);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10f6a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f6ff);
  local_374 = 0x3d;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_370,&local_374);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_348);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f819);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10f87c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f8d4);
  local_3c4 = 0;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_3c0,&local_3c4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_398);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f9ee);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10fa51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10faa9);
  local_414 = 0x18;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_410,&local_414);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10fbc3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10fc26);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fc7e);
  local_464 = 0xe;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_460,&local_464);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10fd98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10fdfb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fe53);
  local_4b4 = 0x3d;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>(local_4b0,&local_4b4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<60l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x10ff6d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x10ffd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110028);
  local_504 = 0;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_500,&local_504);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_4f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x110142);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x1101a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1101fd);
  local_554 = 0xc;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_550,&local_554);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x110317);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x11037a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1103d2);
  local_5a4 = 0x18;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_5a0,&local_5a4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_598);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_578);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x1104ec);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
               in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x11054f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1105a7);
  local_5f4 = 4;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_5f0,&local_5f4);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_5e8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    in_stack_fffffffffffff658 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x1106c1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff660),in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x110724);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11077c);
  local_644 = 0xe;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>(local_640,&local_644);
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<3600l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,
             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [3])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_638);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_618);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    testing::AssertionResult::failure_message((AssertionResult *)0x110884);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff660),in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x1108e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110939);
  local_694 = 0x3039;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_690,&local_694);
  fmt::v5::format<char[12],std::chrono::duration<long,std::ratio<1l,1l>>>
            (in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string(local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_668);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff610);
    in_stack_fffffffffffff618 =
         (char (*) [12])testing::AssertionResult::failure_message((AssertionResult *)0x110a41);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff610,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff660),in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x110a9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110af6);
  local_6e4 = 0x3039;
  pdVar5 = local_6e0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(pdVar5,&local_6e4);
  TVar6 = (Type)((ulong)pdVar5 >> 0x20);
  args = local_6d8;
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,args);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
             (char (*) [6])in_stack_fffffffffffff5e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  std::__cxx11::string::~string((string *)local_6d8);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_6b8);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)args);
    in_stack_fffffffffffff5f8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x110bfe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffff600),
               (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),in_stack_fffffffffffff5f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff660),in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x110c5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110cb3);
  local_734 = 0x3039;
  pdVar5 = local_730;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(pdVar5,&local_734);
  actual_expression = local_728;
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffff618,args);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffff5f8,(char *)actual_expression,(char (*) [9])pdVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  line = (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20);
  std::__cxx11::string::~string(local_728);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_708);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)args);
    testing::AssertionResult::failure_message((AssertionResult *)0x110dbb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffff600),line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff660),in_stack_fffffffffffff658);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff5e0));
    testing::Message::~Message((Message *)0x110e16);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110e6b);
  return;
}

Assistant:

TEST(ChronoTest, FormatSpecs) {
  EXPECT_EQ("%", fmt::format("{:%%}", std::chrono::seconds(0)));
  EXPECT_EQ("\n", fmt::format("{:%n}", std::chrono::seconds(0)));
  EXPECT_EQ("\t", fmt::format("{:%t}", std::chrono::seconds(0)));
  EXPECT_EQ("00", fmt::format("{:%S}", std::chrono::seconds(0)));
  EXPECT_EQ("00", fmt::format("{:%S}", std::chrono::seconds(60)));
  EXPECT_EQ("42", fmt::format("{:%S}", std::chrono::seconds(42)));
  EXPECT_EQ("01.234", fmt::format("{:%S}", std::chrono::milliseconds(1234)));
  EXPECT_EQ("00", fmt::format("{:%M}", std::chrono::minutes(0)));
  EXPECT_EQ("00", fmt::format("{:%M}", std::chrono::minutes(60)));
  EXPECT_EQ("42", fmt::format("{:%M}", std::chrono::minutes(42)));
  EXPECT_EQ("01", fmt::format("{:%M}", std::chrono::seconds(61)));
  EXPECT_EQ("00", fmt::format("{:%H}", std::chrono::hours(0)));
  EXPECT_EQ("00", fmt::format("{:%H}", std::chrono::hours(24)));
  EXPECT_EQ("14", fmt::format("{:%H}", std::chrono::hours(14)));
  EXPECT_EQ("01", fmt::format("{:%H}", std::chrono::minutes(61)));
  EXPECT_EQ("12", fmt::format("{:%I}", std::chrono::hours(0)));
  EXPECT_EQ("12", fmt::format("{:%I}", std::chrono::hours(12)));
  EXPECT_EQ("12", fmt::format("{:%I}", std::chrono::hours(24)));
  EXPECT_EQ("04", fmt::format("{:%I}", std::chrono::hours(4)));
  EXPECT_EQ("02", fmt::format("{:%I}", std::chrono::hours(14)));
  EXPECT_EQ("03:25:45",
            fmt::format("{:%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("03:25", fmt::format("{:%R}", std::chrono::seconds(12345)));
  EXPECT_EQ("03:25:45", fmt::format("{:%T}", std::chrono::seconds(12345)));
}